

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O3

void __thiscall gl4cts::EnhancedLayouts::Utils::Buffer::Bind(Buffer *this)

{
  GLuint GVar1;
  int iVar2;
  GLenum GVar3;
  deUint32 err;
  undefined4 extraout_var;
  
  iVar2 = (*this->m_context->m_renderCtx->_vptr_RenderContext[3])();
  GVar1 = this->m_id;
  GVar3 = GetBufferGLenum(this->m_buffer);
  (**(code **)(CONCAT44(extraout_var,iVar2) + 0x40))(GVar3,GVar1);
  err = (**(code **)(CONCAT44(extraout_var,iVar2) + 0x800))();
  glu::checkError(err,"BindBuffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cEnhancedLayoutsTests.cpp"
                  ,0x6f7);
  return;
}

Assistant:

void Buffer::Bind() const
{
	const Functions& gl = m_context.getRenderContext().getFunctions();

	Bind(gl, m_id, m_buffer);
}